

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O3

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::log
          (ansicolor_sink<spdlog::details::console_nullmutex> *this,double __x)

{
  formatter *pfVar1;
  mapped_type *pmVar2;
  size_t __n;
  long in_RSI;
  undefined1 *__ptr;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  memory_buf_t formatted;
  undefined **local_140;
  undefined1 *local_138;
  size_t local_130;
  ulong local_128;
  undefined1 local_120 [256];
  
  local_130 = 0;
  local_140 = &PTR_grow_001e54e0;
  local_128 = 0xfa;
  pfVar1 = (this->formatter_)._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  local_138 = local_120;
  (*pfVar1->_vptr_formatter[2])(pfVar1,in_RSI,&local_140);
  __n = local_130;
  __ptr = local_138;
  if ((this->should_do_colors_ == true) && (*(ulong *)(in_RSI + 0x28) < *(ulong *)(in_RSI + 0x30)))
  {
    fwrite(local_138,1,*(ulong *)(in_RSI + 0x28),(FILE *)this->target_file_);
    pmVar2 = std::__detail::
             _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->colors_,(key_type *)(in_RSI + 0x10));
    fwrite(pmVar2->data_,1,pmVar2->size_,(FILE *)this->target_file_);
    fwrite(local_138 + *(long *)(in_RSI + 0x28),1,
           *(long *)(in_RSI + 0x30) - *(long *)(in_RSI + 0x28),(FILE *)this->target_file_);
    fwrite((this->reset).data_,1,(this->reset).size_,(FILE *)this->target_file_);
    __n = local_130 - *(long *)(in_RSI + 0x30);
    __ptr = local_138 + *(long *)(in_RSI + 0x30);
  }
  fwrite(__ptr,1,__n,(FILE *)this->target_file_);
  fflush((FILE *)this->target_file_);
  local_140 = &PTR_grow_001e54e0;
  dVar3 = extraout_XMM0_Qa;
  if (local_138 != local_120) {
    operator_delete(local_138,local_128);
    dVar3 = extraout_XMM0_Qa_00;
  }
  return dVar3;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::log(const details::log_msg &msg)
{
    // Wrap the originally formatted message in color codes.
    // If color is not supported in the terminal, log as is instead.
    std::lock_guard<mutex_t> lock(mutex_);

    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    if (should_do_colors_ && msg.color_range_end > msg.color_range_start)
    {
        // before color range
        print_range_(formatted, 0, msg.color_range_start);
        // in color range
        print_ccode_(colors_[msg.level]);
        print_range_(formatted, msg.color_range_start, msg.color_range_end);
        print_ccode_(reset);
        // after color range
        print_range_(formatted, msg.color_range_end, formatted.size());
    }
    else // no color
    {
        print_range_(formatted, 0, formatted.size());
    }
    fflush(target_file_);
}